

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O1

bool __thiscall
cmTargetPropCommandBase::ProcessContentArgs
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,uint *argIndex,bool prepend,bool system)

{
  uint uVar1;
  cmTargetPropCommandBase *pcVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  undefined7 in_register_00000009;
  undefined1 uVar6;
  uint uVar7;
  ulong uVar8;
  pointer pbVar9;
  undefined7 in_register_00000081;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  long *local_80 [2];
  long local_70 [2];
  undefined4 local_60;
  undefined4 local_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  cmTargetPropCommandBase *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000081,system);
  local_60 = (undefined4)CONCAT71(in_register_00000009,prepend);
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + *argIndex;
  iVar4 = std::__cxx11::string::compare((char *)pbVar10);
  if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)pbVar10), iVar4 != 0)) &&
     (iVar4 = std::__cxx11::string::compare((char *)pbVar10), iVar4 != 0)) {
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"called with invalid arguments","");
    std::__cxx11::string::_M_assign((string *)&this->Status->Error);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    return false;
  }
  uVar7 = *argIndex;
  uVar1 = uVar7 + 1;
  uVar8 = (ulong)uVar1;
  *argIndex = uVar1;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = this;
  if (uVar8 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)) {
    uVar7 = uVar7 + 2;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar9 + uVar8));
      if (((iVar4 == 0) ||
          (iVar4 = std::__cxx11::string::compare
                             ((char *)((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar8)),
          iVar4 == 0)) ||
         (iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar8)),
         iVar4 == 0)) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar8);
      *argIndex = *argIndex + 1;
      uVar8 = (ulong)uVar7;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
    } while (uVar8 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5))
    ;
  }
  pcVar2 = local_38;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_003ce589:
    iVar4 = (*pcVar2->_vptr_cmTargetPropCommandBase[3])
                      (pcVar2,pbVar10,&local_58,(ulong)(byte)local_60,(ulong)(byte)local_5c);
    uVar6 = (undefined1)iVar4;
  }
  else {
    TVar5 = cmTarget::GetType(local_38->Target);
    if (((TVar5 == INTERFACE_LIBRARY) &&
        (iVar4 = std::__cxx11::string::compare((char *)pbVar10), iVar4 != 0)) &&
       (iVar4 = std::__cxx11::string::compare((char *)&pcVar2->Property), iVar4 != 0)) {
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"may only set INTERFACE properties on INTERFACE targets","");
      std::__cxx11::string::_M_assign((string *)&pcVar2->Status->Error);
    }
    else {
      bVar3 = cmTarget::IsImported(pcVar2->Target);
      if ((bVar3) && (iVar4 = std::__cxx11::string::compare((char *)pbVar10), iVar4 != 0)) {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_80,"may only set INTERFACE properties on IMPORTED targets","");
        std::__cxx11::string::_M_assign((string *)&pcVar2->Status->Error);
      }
      else {
        TVar5 = cmTarget::GetType(pcVar2->Target);
        if ((TVar5 != UTILITY) ||
           (iVar4 = std::__cxx11::string::compare((char *)pbVar10), iVar4 == 0)) goto LAB_003ce589;
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_80,"may only set PRIVATE properties on custom targets","");
        std::__cxx11::string::_M_assign((string *)&pcVar2->Status->Error);
      }
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    uVar6 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return (bool)uVar6;
}

Assistant:

bool cmTargetPropCommandBase::ProcessContentArgs(
  std::vector<std::string> const& args, unsigned int& argIndex, bool prepend,
  bool system)
{
  std::string const& scope = args[argIndex];

  if (scope != "PUBLIC" && scope != "PRIVATE" && scope != "INTERFACE") {
    this->SetError("called with invalid arguments");
    return false;
  }

  ++argIndex;

  std::vector<std::string> content;

  for (unsigned int i = argIndex; i < args.size(); ++i, ++argIndex) {
    if (args[i] == "PUBLIC" || args[i] == "PRIVATE" ||
        args[i] == "INTERFACE") {
      break;
    }
    content.push_back(args[i]);
  }
  if (!content.empty()) {
    if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
        scope != "INTERFACE" && this->Property != "SOURCES") {
      this->SetError("may only set INTERFACE properties on INTERFACE targets");
      return false;
    }
    if (this->Target->IsImported() && scope != "INTERFACE") {
      this->SetError("may only set INTERFACE properties on IMPORTED targets");
      return false;
    }
    if (this->Target->GetType() == cmStateEnums::UTILITY &&
        scope != "PRIVATE") {
      this->SetError("may only set PRIVATE properties on custom targets");
      return false;
    }
  }
  return this->PopulateTargetProperties(scope, content, prepend, system);
}